

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,
          ArrayPtr<const_char> *params_10,ArrayPtr<const_char> *params_11,
          ArrayPtr<const_char> *params_12,ArrayPtr<const_char> *params_13)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *__n;
  long lVar3;
  size_t result;
  size_t sVar4;
  size_t result_2;
  char *pcVar5;
  String local_e8;
  char *local_d0 [3];
  size_t sStack_b8;
  size_t local_b0;
  size_t sStack_a8;
  size_t local_a0;
  size_t sStack_98;
  size_t local_90;
  size_t sStack_88;
  size_t local_80;
  size_t sStack_78;
  size_t local_70;
  size_t sStack_68;
  StringTree *local_60;
  StringTree *local_58;
  StringTree *local_50;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_38 = (this->text).content.ptr;
  local_d0[0] = local_38;
  local_d0[1] = params->ptr;
  local_d0[2] = (params_1->text).content.ptr;
  sStack_b8 = params_2->size_;
  local_b0 = params_3->size_;
  sStack_a8 = params_4->size_;
  local_a0 = params_5->size_;
  sStack_98 = params_6->size_;
  local_90 = params_7->size_;
  sStack_88 = params_8->size_;
  local_80 = params_9->size_;
  sStack_78 = params_10->size_;
  local_70 = params_11->size_;
  sStack_68 = params_12->size_;
  sVar4 = 0;
  lVar3 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_d0 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x70);
  __return_storage_ptr__->size_ = sVar4;
  local_d0[1] = (char *)0x0;
  sVar4 = 0;
  lVar3 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_d0 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x70);
  local_60 = this;
  local_58 = (StringTree *)params;
  local_50 = params_1;
  local_48 = params_2;
  local_40 = params_3;
  heapString(&local_e8,sVar4);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar4 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar4,sVar4,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_e8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_e8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_e8.content.disposer;
  local_d0[0] = (char *)0x0;
  local_d0[1] = (char *)0x1;
  local_d0[2] = (char *)0x0;
  sStack_b8 = 0;
  local_b0 = 0;
  sStack_a8 = 0;
  local_a0 = 0;
  sStack_98 = 0;
  local_90 = 0;
  sStack_88 = 0;
  local_80 = 0;
  sStack_78 = 0;
  local_70 = 0;
  sStack_68 = 0;
  sVar4 = 0;
  lVar3 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_d0 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x70);
  local_e8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar4,sVar4,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_e8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_e8.content.size_ = sVar4;
  if (pBVar2 != (Branch *)0x0) {
    sVar4 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_e8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_e8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_e8.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (local_60->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pcVar5,(void *)local_60->size_,(size_t)__n);
    pcVar5 = pcVar5 + (long)__n;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar5,0,local_58,(ArrayPtr<const_char> *)local_50,local_48,
             local_40,params_4,params_5,params_6,params_7,params_8,params_9,params_10,params_11,
             params_12);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}